

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcEncrypt.c
# Opt level: O1

void cbc256Encrypt(ThreefishKey_t *key,uint64_t *iv,uint64_t *plain_text,uint64_t num_blocks)

{
  ulong uVar1;
  
  *plain_text = *plain_text ^ *iv;
  plain_text[1] = plain_text[1] ^ iv[1];
  plain_text[2] = plain_text[2] ^ iv[2];
  plain_text[3] = plain_text[3] ^ iv[3];
  if (num_blocks << 2 != 0) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        *plain_text = *plain_text ^ plain_text[-4];
        plain_text[1] = plain_text[1] ^ plain_text[-3];
        plain_text[2] = plain_text[2] ^ plain_text[-2];
        plain_text[3] = plain_text[3] ^ plain_text[-1];
      }
      threefishEncryptBlockWords(key,plain_text,plain_text);
      uVar1 = uVar1 + 4;
      plain_text = plain_text + 4;
    } while (uVar1 < num_blocks << 2);
  }
  return;
}

Assistant:

void cbc256Encrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* plain_text,
                   const uint64_t num_blocks)
{
    //xor the initialization vector with the first block of input
    plain_text[0] ^= iv[0]; plain_text[1] ^= iv[1];
    plain_text[2] ^= iv[2]; plain_text[3] ^= iv[3];

    //run each block through the cipher chaining on the previous block 
    for(uint64_t block=0; block<(num_blocks*SAFE_SLICE); block+=SAFE_SLICE)
    {
        if(block > 0) //feedback the previous into the next block by xoring them together
        {
            const uint64_t offset = block-SAFE_SLICE;
            plain_text[block] ^= plain_text[offset];
            plain_text[block+1] ^= plain_text[offset+1];
            plain_text[block+2] ^= plain_text[offset+2];
            plain_text[block+3] ^= plain_text[offset+3];
        }

        //run the current block through the cipher
        threefishEncryptBlockWords(key, &plain_text[block], &plain_text[block]);
    }
}